

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O0

void cvSetEta(CVodeMem cv_mem)

{
  realtype local_28;
  realtype local_20;
  double local_18;
  realtype local_10;
  CVodeMem cv_mem_local;
  
  if ((cv_mem->cv_eta < cv_mem->cv_eta_min_fx || cv_mem->cv_eta == cv_mem->cv_eta_min_fx) ||
     (cv_mem->cv_eta_max_fx <= cv_mem->cv_eta)) {
    if (cv_mem->cv_eta < cv_mem->cv_eta_max_fx) {
      if (cv_mem->cv_eta < cv_mem->cv_eta_min || cv_mem->cv_eta == cv_mem->cv_eta_min) {
        local_20 = cv_mem->cv_eta_min;
      }
      else {
        local_20 = cv_mem->cv_eta;
      }
      cv_mem->cv_eta = local_20;
      if (cv_mem->cv_eta <= cv_mem->cv_hmin / ABS(cv_mem->cv_h)) {
        local_28 = cv_mem->cv_hmin / ABS(cv_mem->cv_h);
      }
      else {
        local_28 = cv_mem->cv_eta;
      }
      cv_mem->cv_eta = local_28;
    }
    else {
      if (cv_mem->cv_etamax <= cv_mem->cv_eta) {
        local_10 = cv_mem->cv_etamax;
      }
      else {
        local_10 = cv_mem->cv_eta;
      }
      cv_mem->cv_eta = local_10;
      if (1.0 <= ABS(cv_mem->cv_h) * cv_mem->cv_hmax_inv * cv_mem->cv_eta) {
        local_18 = ABS(cv_mem->cv_h) * cv_mem->cv_hmax_inv * cv_mem->cv_eta;
      }
      else {
        local_18 = 1.0;
      }
      cv_mem->cv_eta = cv_mem->cv_eta / local_18;
    }
    cv_mem->cv_hprime = cv_mem->cv_h * cv_mem->cv_eta;
    if (cv_mem->cv_qprime < cv_mem->cv_q) {
      cv_mem->cv_nscon = 0;
    }
  }
  else {
    cv_mem->cv_eta = 1.0;
    cv_mem->cv_hprime = cv_mem->cv_h;
  }
  return;
}

Assistant:

static void cvSetEta(CVodeMem cv_mem)
{
  if ((cv_mem->cv_eta > cv_mem->cv_eta_min_fx) &&
      (cv_mem->cv_eta < cv_mem->cv_eta_max_fx))
  {
    /* Eta is within the fixed step bounds, retain step size */
    cv_mem->cv_eta = ONE;
    cv_mem->cv_hprime = cv_mem->cv_h;
  }
  else
  {
    if (cv_mem->cv_eta >= cv_mem->cv_eta_max_fx)
    {
      /* Increase the step size, limit eta by etamax and hmax */
      cv_mem->cv_eta = SUNMIN(cv_mem->cv_eta, cv_mem->cv_etamax);
      cv_mem->cv_eta /= SUNMAX(ONE, SUNRabs(cv_mem->cv_h) *
                               cv_mem->cv_hmax_inv * cv_mem->cv_eta);
    }
    else
    {
      /* Reduce the step size, limit eta by etamin and hmin */
      cv_mem->cv_eta = SUNMAX(cv_mem->cv_eta, cv_mem->cv_eta_min);
      cv_mem->cv_eta = SUNMAX(cv_mem->cv_eta, cv_mem->cv_hmin / SUNRabs(cv_mem->cv_h));
    }
    /* Set hprime */
    cv_mem->cv_hprime = cv_mem->cv_h * cv_mem->cv_eta;
    if (cv_mem->cv_qprime < cv_mem->cv_q) cv_mem->cv_nscon = 0;
  }
}